

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::isInputBuiltIn(HlslParseContext *this,TQualifier *qualifier)

{
  uint uVar1;
  EShLanguage EVar2;
  byte bVar3;
  
  uVar1 = *(uint *)&qualifier->field_0x8 >> 7 & 0x1ff;
  bVar3 = 0;
  switch(uVar1) {
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex;
    break;
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x3a:
  case 0x3c:
  case 0x3d:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
    break;
  case 0x1e:
  case 0x1f:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    bVar3 = 1;
    if (EShLangCompute < EVar2) break;
    bVar3 = 0xe;
    goto LAB_00421ee9;
  case 0x21:
  case 0x22:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    bVar3 = EVar2 != EShLangCompute && EVar2 != EShLangVertex;
    break;
  case 0x33:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language - EShLangTessControl < 3;
    break;
  case 0x34:
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EShLangFragment < EVar2) {
      bVar3 = 0;
      break;
    }
    bVar3 = 0x1a;
LAB_00421ee9:
    bVar3 = bVar3 >> ((byte)EVar2 & 0x1f);
    break;
  case 0x35:
  case 0x36:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment;
    break;
  case 0x37:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language - EShLangTessControl < 2;
    break;
  case 0x38:
  case 0x39:
  case 0x3b:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation;
    break;
  case 0x50:
    bVar3 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute;
    break;
  default:
    bVar3 = 0;
    if (uVar1 - 1 < 6) {
      bVar3 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangCompute;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool HlslParseContext::isInputBuiltIn(const TQualifier& qualifier) const
{
    switch (qualifier.builtIn) {
    case EbvPosition:
    case EbvPointSize:
        return language != EShLangVertex && language != EShLangCompute && language != EShLangFragment;
    case EbvClipDistance:
    case EbvCullDistance:
        return language != EShLangVertex && language != EShLangCompute;
    case EbvFragCoord:
    case EbvFace:
    case EbvHelperInvocation:
    case EbvLayer:
    case EbvPointCoord:
    case EbvSampleId:
    case EbvSampleMask:
    case EbvSamplePosition:
    case EbvViewportIndex:
        return language == EShLangFragment;
    case EbvGlobalInvocationId:
    case EbvLocalInvocationIndex:
    case EbvLocalInvocationId:
    case EbvNumWorkGroups:
    case EbvWorkGroupId:
    case EbvWorkGroupSize:
        return language == EShLangCompute;
    case EbvInvocationId:
        return language == EShLangTessControl || language == EShLangTessEvaluation || language == EShLangGeometry;
    case EbvPatchVertices:
        return language == EShLangTessControl || language == EShLangTessEvaluation;
    case EbvInstanceId:
    case EbvInstanceIndex:
    case EbvVertexId:
    case EbvVertexIndex:
        return language == EShLangVertex;
    case EbvPrimitiveId:
        return language == EShLangGeometry || language == EShLangFragment || language == EShLangTessControl;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        return language == EShLangTessEvaluation;
    case EbvTessCoord:
        return language == EShLangTessEvaluation;
    case EbvViewIndex:
        return language != EShLangCompute;
    default:
        return false;
    }
}